

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O2

uint8_t __thiscall lsim::SimCircuit::read_byte(SimCircuit *this,uint32_t comp_id)

{
  Simulator *this_00;
  uint uVar1;
  pin_t pin;
  Value VVar2;
  SimComponent *this_01;
  byte bVar3;
  char *__assertion;
  int i;
  uint index;
  
  this_01 = component_by_id(this,comp_id);
  if (this_01 == (SimComponent *)0x0) {
    __assertion = "comp";
    uVar1 = 0x6a;
  }
  else {
    if (this_01->m_output_start == 8) {
      bVar3 = 0;
      uVar1 = 8;
      for (index = 0; index < uVar1; index = index + 1) {
        this_00 = this->m_sim;
        pin = SimComponent::pin_by_index(this_01,index);
        VVar2 = Simulator::read_pin(this_00,pin);
        bVar3 = bVar3 | (byte)(VVar2 << ((byte)index & 0x1f));
        uVar1 = this_01->m_output_start;
      }
      return bVar3;
    }
    __assertion = "comp->num_inputs() == 8";
    uVar1 = 0x6c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,uVar1,"uint8_t lsim::SimCircuit::read_byte(uint32_t)");
}

Assistant:

uint8_t SimCircuit::read_byte(uint32_t comp_id) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    assert(comp->num_inputs() == 8);
    uint8_t result = 0;

    for (int i = 0; i < comp->num_inputs(); ++i) {
        result |= ((int) m_sim->read_pin(comp->pin_by_index(comp->input_pin_index(i)))) << i;
    }

    return result;
}